

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::FullUncertaintyWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  bool bVar1;
  reference pvVar2;
  pointer ppVar3;
  size_type sVar4;
  reference ppVar5;
  reference ppVar6;
  reference piVar7;
  mapped_type *pmVar8;
  undefined4 in_register_0000000c;
  long *plVar9;
  int in_stack_00000008;
  code *local_218;
  code *local_1e8;
  _Self local_1c8;
  _Self local_1c0;
  iterator iter_1;
  lossval lv_1;
  iterator iStack_198;
  int sidx;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  key_type kStack_178;
  pair<const_outkey2,_OutLosses> x_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> ensemble;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  _Self local_110;
  _Self local_108;
  iterator iter;
  lossval lv;
  pair<const_outkey2,_OutLosses> x;
  _Self local_c8;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  undefined1 local_a0 [8];
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  int eptype_local;
  int epcalc_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  std::
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::map((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
         *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_a0,&this->periodstoweighting_);
  pvVar2 = std::
           vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
           ::operator[](this->out_loss_,1);
  __end1 = std::
           map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
           ::begin(pvVar2);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
       ::end(pvVar2);
  while (bVar1 = std::operator!=(&__end1,&local_c8), bVar1) {
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end1);
    x.first.sidx = (int)(ppVar6->second).max_out_loss;
    lv.value = (OASIS_FLOAT)(ppVar6->first).summary_id;
    lv._20_4_ = (ppVar6->first).period_no;
    x.first.summary_id = (ppVar6->first).sidx;
    x.first.period_no = (int)(ppVar6->second).agg_out_loss;
    plVar9 = (long *)((long)&x.first.period_no + CONCAT44(in_register_0000000c,epcalc));
    local_1e8 = (code *)GetOutLoss;
    if ((GetOutLoss & 1) != 0) {
      local_1e8 = *(code **)(*plVar9 + (GetOutLoss - 1));
    }
    lv.period_weighting._0_4_ = (*local_1e8)(plVar9);
    local_108._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::find
                   (&this->periodstoweighting_,(key_type *)&lv.field_0x14);
    local_110._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::end
                   (&this->periodstoweighting_);
    bVar1 = std::operator!=(&local_108,&local_110);
    if (bVar1) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->(&local_108);
      lv._0_8_ = ppVar3->second;
      iter._M_node._0_4_ = lv._20_4_;
      pmVar8 = std::
               map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
               ::operator[]((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                             *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,(key_type *)&lv.value);
      std::vector<lossval,_std::allocator<lossval>_>::push_back(pmVar8,(value_type *)&iter);
    }
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::erase
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               local_a0,(key_type *)&lv.field_0x14);
    std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end1);
  }
  WriteExceedanceProbabilityTable
            (this,fileIDs,
             (map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
              *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count,1.0,
             eptype,eptype_tvar,in_stack_00000008,
             (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_a0,1);
  if (((this->ordFlag_ & 1U) == 0) &&
     (sVar4 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::size(&this->ensembletosidx_), sVar4 != 0)) {
    __end2 = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::begin(&this->ensembletosidx_);
    ensemble.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::end(&this->ensembletosidx_);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&ensemble.second.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage), bVar1) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
               operator*(&__end2);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&__range3,ppVar5);
      std::
      map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
      ::clear((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
               *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
      operator=((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
                local_a0,&this->periodstoweighting_);
      pvVar2 = std::
               vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               ::operator[](this->out_loss_,1);
      __end3 = std::
               map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
               ::begin(pvVar2);
      x_1.second = (OutLosses)
                   std::
                   map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                   ::end(pvVar2);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&x_1.second), bVar1) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end3);
        __range4._4_4_ = (ppVar6->first).summary_id;
        kStack_178 = (ppVar6->first).period_no;
        x_1.first._0_8_ = *(undefined8 *)&(ppVar6->first).sidx;
        x_1.first.sidx = (int)(ppVar6->second).max_out_loss;
        __end4 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&ensemble);
        iStack_198 = std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)&ensemble);
        while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffe68), bVar1) {
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          if (x_1.first.summary_id == *piVar7) {
            plVar9 = (long *)((long)&x_1.first.period_no + CONCAT44(in_register_0000000c,epcalc));
            local_218 = (code *)GetOutLoss;
            if ((GetOutLoss & 1) != 0) {
              local_218 = *(code **)(*plVar9 + (GetOutLoss - 1));
            }
            (*local_218)(plVar9);
            local_1c0._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 find(&this->periodstoweighting_,&kStack_178);
            local_1c8._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 end(&this->periodstoweighting_);
            bVar1 = std::operator!=(&local_1c0,&local_1c8);
            if (bVar1) {
              std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->(&local_1c0);
              iter_1._M_node._0_4_ = kStack_178;
              pmVar8 = std::
                       map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                       ::operator[]((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                                     *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count,(key_type *)((long)&__range4 + 4));
              std::vector<lossval,_std::allocator<lossval>_>::push_back
                        (pmVar8,(value_type *)&iter_1);
            }
            std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
            erase((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)local_a0,&kStack_178);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
        std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end3);
      }
      WriteExceedanceProbabilityTable
                (this,fileIDs,
                 (map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                  *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count,1.0,
                 eptype,(int)__range3,in_stack_00000008,
                 (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *
                 )local_a0,1);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&__range3);
      std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
      operator++(&__end2);
    }
  }
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_a0);
  std::
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~map((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void aggreports::FullUncertaintyWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  std::map<int, lossvec2> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[SAMPLES]) {
    lossval lv;
    lv.value = (x.second.*GetOutLoss)();
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      lv.period_weighting = iter->second;
      lv.period_no = x.first.period_no;   // for debugging
      items[x.first.summary_id].push_back(lv);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  WriteExceedanceProbabilityTable(fileIDs, items, 1, epcalc, eptype,
				  eptype_tvar, unusedperiodstoweighting);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      unusedperiodstoweighting = periodstoweighting_;
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    lossval lv;
	    lv.value = (x.second.*GetOutLoss)();
	    auto iter = periodstoweighting_.find(x.first.period_no);
	    if (iter != periodstoweighting_.end()) {
	      lv.period_weighting = iter->second;
	      lv.period_no = x.first.period_no;   // for debugging
	      items[x.first.summary_id].push_back(lv);
	    }
	    unusedperiodstoweighting.erase(x.first.period_no);
	  }
	}
      }
      // EPType doubles as ensemble ID for legacy output
      WriteExceedanceProbabilityTable(fileIDs, items, 1, epcalc, ensemble.first,
				      eptype_tvar, unusedperiodstoweighting, 1);
    }
  }

}